

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O1

Sequence<DNA> * __thiscall
Sequence<DNA>::Reverse(Sequence<DNA> *__return_storage_ptr__,Sequence<DNA> *this)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  char *pcVar4;
  pointer pcVar5;
  
  Sequence(__return_storage_ptr__,this);
  pcVar2 = (__return_storage_ptr__->sequence)._M_dataplus._M_p;
  sVar3 = (__return_storage_ptr__->sequence)._M_string_length;
  pcVar5 = pcVar2 + (sVar3 - 1);
  if (pcVar2 < pcVar5 && sVar3 != 0) {
    do {
      pcVar4 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar5;
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + -1;
      pcVar2 = pcVar4;
    } while (pcVar4 < pcVar5);
  }
  pcVar2 = (__return_storage_ptr__->quality)._M_dataplus._M_p;
  sVar3 = (__return_storage_ptr__->quality)._M_string_length;
  pcVar5 = pcVar2 + (sVar3 - 1);
  if (pcVar2 < pcVar5 && sVar3 != 0) {
    do {
      pcVar4 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar5;
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + -1;
      pcVar2 = pcVar4;
    } while (pcVar4 < pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

Sequence< A > Sequence< A >::Reverse() const {
  Sequence rev = *this;
  // Reverse sequence and quality
  std::reverse( rev.sequence.begin(), rev.sequence.end() );
  std::reverse( rev.quality.begin(), rev.quality.end() );
  return rev;
}